

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExecuteInstruction.cpp
# Opt level: O1

int do_sub(void)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  vm_register *pvVar4;
  undefined4 *puVar5;
  short sVar6;
  uint uVar7;
  char cVar8;
  uint *puVar9;
  byte bVar10;
  bool bVar11;
  
  pvVar4 = registe_ptr;
  uVar7 = registe_ptr->IP;
  bVar1 = code_ptr[uVar7 + 2];
  bVar2 = bVar1 >> 4;
  bVar10 = bVar1 & 0xf;
  if (code_ptr[uVar7 + 1] == '\x01') {
    if (bVar10 != 2) {
      if (bVar10 != 1) {
        if ((bVar1 & 0xf) != 0) goto LAB_00103898;
        cVar8 = (char)*register_list[bVar2] - code_ptr[(ulong)uVar7 + 3];
        *(char *)register_list[bVar2] = cVar8;
        pvVar4 = registe_ptr;
        if (cVar8 != '\0') {
          bVar11 = cVar8 < '\0';
          if (cVar8 < '\x01') goto LAB_001037ec;
          goto LAB_0010383c;
        }
        goto LAB_00103879;
      }
      puVar9 = register_list[bVar2];
      sVar6 = (short)*puVar9 - *(short *)(code_ptr + (ulong)uVar7 + 3);
LAB_00103832:
      *(short *)puVar9 = sVar6;
      if (sVar6 != 0) {
        bVar11 = sVar6 < 0;
        if (0 < sVar6) {
LAB_0010383c:
          pvVar4->flag[0] = '\x01';
          pvVar4->flag[1] = '\x01';
          return 1;
        }
LAB_001037ec:
        if (!bVar11) {
          return 1;
        }
        pvVar4->flag[0] = '\x01';
        pvVar4->flag[1] = '\0';
        return 1;
      }
      goto LAB_00103879;
    }
    puVar9 = register_list[bVar2];
    uVar7 = *puVar9 - *(int *)(code_ptr + (ulong)uVar7 + 3);
  }
  else {
    if (code_ptr[uVar7 + 1] != '\0') {
LAB_00103898:
      puVar5 = (undefined4 *)__cxa_allocate_exception(4);
      *puVar5 = 0xf6;
      __cxa_throw(puVar5,&int::typeinfo,0);
    }
    bVar3 = (byte)code_ptr[uVar7 + 3] >> 4;
    if (bVar10 != 2) {
      if (bVar10 != 1) {
        if ((bVar1 & 0xf) != 0) goto LAB_00103898;
        cVar8 = (char)*register_list[bVar2] - (char)*register_list[bVar3];
        *(char *)register_list[bVar2] = cVar8;
        pvVar4 = registe_ptr;
        if (cVar8 == '\0') goto LAB_00103879;
        bVar11 = cVar8 < '\0';
        if ('\0' < cVar8) goto LAB_0010383c;
        goto LAB_001037ec;
      }
      puVar9 = register_list[bVar2];
      sVar6 = (short)*puVar9 - (short)*register_list[bVar3];
      goto LAB_00103832;
    }
    puVar9 = register_list[bVar2];
    uVar7 = *puVar9 - *register_list[bVar3];
  }
  *puVar9 = uVar7;
  if (uVar7 != 0) {
    pvVar4->flag[0] = '\x01';
    if (0 < (int)uVar7) {
      pvVar4->flag[1] = '\x01';
      return 1;
    }
    pvVar4->flag[1] = '\0';
    return 1;
  }
LAB_00103879:
  pvVar4->flag[0] = '\0';
  return 1;
}

Assistant:

int do_sub() {
	uint8_t high = (uint8_t)code_ptr[registe_ptr->IP + 2] / 0x10;
	uint8_t low = (uint8_t)code_ptr[registe_ptr->IP + 2] % 0x10;
	if (code_ptr[registe_ptr->IP + 1] == 0)//0型命令
	{
		uint8_t highb = (uint8_t)code_ptr[registe_ptr->IP + 3] / 0x10;
		if (low == 0) {
			char*Ra = (char *)register_list[high];
			char*Rb = (char*)register_list[highb];
			*Ra -= *Rb;
			set_flag(*Ra);
		}
		else if (low == 1)
		{
			int16_t*Ra = (int16_t *)register_list[high];
			int16_t*Rb = (int16_t *)register_list[highb];
			*Ra -= *Rb;
			set_flag(*Ra);
		}
		else if (low == 2)
		{
			unsigned*Ra = (unsigned *)register_list[high];
			unsigned*Rb = (unsigned*)register_list[highb];
			*Ra -= *Rb;
			set_flag(*Ra);
		}
		else throw(LVM_EXECUTE_ERROR);
	}
	else if (code_ptr[registe_ptr->IP + 1] == 1) {//1型命令
		if (low == 0)//低位运算
		{
			unsigned temp = *(unsigned*)(code_ptr + registe_ptr->IP + 2 + 1);//获得立即数
			char *R = (char *)register_list[high];
			*R -= temp;
			set_flag(*R);
		}
		else if (low == 1)//高位运算
		{
			unsigned temp = *(unsigned*)(code_ptr + registe_ptr->IP + 2 + 1);//获得立即数
			int16_t *R = (int16_t *)register_list[high];
			*R -= temp;
			set_flag(*R);
		}
		else if (low == 2)//全运算
		{
			unsigned temp = *(unsigned*)(code_ptr + registe_ptr->IP + 2 + 1);//获得立即数
			unsigned *R = (unsigned *)register_list[high];
			*R -= temp;
			set_flag(*R);
		}
		else throw(LVM_EXECUTE_ERROR);

	}
	else throw(LVM_EXECUTE_ERROR);
	return LVM_SUCCESS;
}